

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O3

int prvTidyInlineDup(TidyDocImpl *doc,Node *node)

{
  Lexer *pLVar1;
  int iVar2;
  
  pLVar1 = doc->lexer;
  iVar2 = pLVar1->istacksize - pLVar1->istackbase;
  if (0 < iVar2) {
    pLVar1->insert = pLVar1->istack + pLVar1->istackbase;
    pLVar1->inode = node;
  }
  return iVar2;
}

Assistant:

int TY_(InlineDup)( TidyDocImpl* doc, Node* node )
{
    Lexer* lexer = doc->lexer;
    int n;

    if ((n = lexer->istacksize - lexer->istackbase) > 0)
    {
        lexer->insert = &(lexer->istack[lexer->istackbase]);
        lexer->inode = node;
    }

    return n;
}